

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.cpp
# Opt level: O0

Data * Integer::minus(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  Integer *this;
  reference ppDVar1;
  Integer *result;
  vector<Data_*,_std::allocator<Data_*>_> *dataPara_local;
  
  this = (Integer *)operator_new(0x18);
  ppDVar1 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[](dataPara,0);
  Integer(this,(long *)(*ppDVar1 + 1));
  ppDVar1 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[](dataPara,1);
  this->value = this->value - (long)(*ppDVar1)[1]._vptr_Data;
  return &this->super_Data;
}

Assistant:

Data *Integer::minus(std::vector<Data *> *dataPara) {
    auto result = new Integer(((Integer *) ((*dataPara)[0]))->value);
    result->value -= ((Integer *) ((*dataPara)[1]))->value;
    return result;
}